

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Terminal.c
# Opt level: O0

void kwsysTerminalSetVT100Color(FILE *stream,int color)

{
  uint uVar1;
  int color_local;
  FILE *stream_local;
  
  if (color == 0) {
    fprintf((FILE *)stream,"\x1b[0m");
  }
  else {
    switch(color & 0xf) {
    case 0:
      fprintf((FILE *)stream,"\x1b[0m");
      break;
    case 1:
      fprintf((FILE *)stream,"\x1b[30m");
      break;
    case 2:
      fprintf((FILE *)stream,"\x1b[31m");
      break;
    case 3:
      fprintf((FILE *)stream,"\x1b[32m");
      break;
    case 4:
      fprintf((FILE *)stream,"\x1b[33m");
      break;
    case 5:
      fprintf((FILE *)stream,"\x1b[34m");
      break;
    case 6:
      fprintf((FILE *)stream,"\x1b[35m");
      break;
    case 7:
      fprintf((FILE *)stream,"\x1b[36m");
      break;
    case 8:
      fprintf((FILE *)stream,"\x1b[37m");
    }
    uVar1 = color & 0xf0;
    if (uVar1 == 0x10) {
      fprintf((FILE *)stream,"\x1b[40m");
    }
    else if (uVar1 == 0x20) {
      fprintf((FILE *)stream,"\x1b[41m");
    }
    else if (uVar1 == 0x30) {
      fprintf((FILE *)stream,"\x1b[42m");
    }
    else if (uVar1 == 0x40) {
      fprintf((FILE *)stream,"\x1b[43m");
    }
    else if (uVar1 == 0x50) {
      fprintf((FILE *)stream,"\x1b[44m");
    }
    else if (uVar1 == 0x60) {
      fprintf((FILE *)stream,"\x1b[45m");
    }
    else if (uVar1 == 0x70) {
      fprintf((FILE *)stream,"\x1b[46m");
    }
    else if (uVar1 == 0x80) {
      fprintf((FILE *)stream,"\x1b[47m");
    }
    if ((color & 0x100U) != 0) {
      fprintf((FILE *)stream,"\x1b[1m");
    }
  }
  return;
}

Assistant:

static void kwsysTerminalSetVT100Color(FILE* stream, int color)
{
  if (color == kwsysTerminal_Color_Normal) {
    fprintf(stream, KWSYS_TERMINAL_VT100_NORMAL);
    return;
  }

  switch (color & kwsysTerminal_Color_ForegroundMask) {
    case kwsysTerminal_Color_Normal:
      fprintf(stream, KWSYS_TERMINAL_VT100_NORMAL);
      break;
    case kwsysTerminal_Color_ForegroundBlack:
      fprintf(stream, KWSYS_TERMINAL_VT100_FOREGROUND_BLACK);
      break;
    case kwsysTerminal_Color_ForegroundRed:
      fprintf(stream, KWSYS_TERMINAL_VT100_FOREGROUND_RED);
      break;
    case kwsysTerminal_Color_ForegroundGreen:
      fprintf(stream, KWSYS_TERMINAL_VT100_FOREGROUND_GREEN);
      break;
    case kwsysTerminal_Color_ForegroundYellow:
      fprintf(stream, KWSYS_TERMINAL_VT100_FOREGROUND_YELLOW);
      break;
    case kwsysTerminal_Color_ForegroundBlue:
      fprintf(stream, KWSYS_TERMINAL_VT100_FOREGROUND_BLUE);
      break;
    case kwsysTerminal_Color_ForegroundMagenta:
      fprintf(stream, KWSYS_TERMINAL_VT100_FOREGROUND_MAGENTA);
      break;
    case kwsysTerminal_Color_ForegroundCyan:
      fprintf(stream, KWSYS_TERMINAL_VT100_FOREGROUND_CYAN);
      break;
    case kwsysTerminal_Color_ForegroundWhite:
      fprintf(stream, KWSYS_TERMINAL_VT100_FOREGROUND_WHITE);
      break;
  }
  switch (color & kwsysTerminal_Color_BackgroundMask) {
    case kwsysTerminal_Color_BackgroundBlack:
      fprintf(stream, KWSYS_TERMINAL_VT100_BACKGROUND_BLACK);
      break;
    case kwsysTerminal_Color_BackgroundRed:
      fprintf(stream, KWSYS_TERMINAL_VT100_BACKGROUND_RED);
      break;
    case kwsysTerminal_Color_BackgroundGreen:
      fprintf(stream, KWSYS_TERMINAL_VT100_BACKGROUND_GREEN);
      break;
    case kwsysTerminal_Color_BackgroundYellow:
      fprintf(stream, KWSYS_TERMINAL_VT100_BACKGROUND_YELLOW);
      break;
    case kwsysTerminal_Color_BackgroundBlue:
      fprintf(stream, KWSYS_TERMINAL_VT100_BACKGROUND_BLUE);
      break;
    case kwsysTerminal_Color_BackgroundMagenta:
      fprintf(stream, KWSYS_TERMINAL_VT100_BACKGROUND_MAGENTA);
      break;
    case kwsysTerminal_Color_BackgroundCyan:
      fprintf(stream, KWSYS_TERMINAL_VT100_BACKGROUND_CYAN);
      break;
    case kwsysTerminal_Color_BackgroundWhite:
      fprintf(stream, KWSYS_TERMINAL_VT100_BACKGROUND_WHITE);
      break;
  }
  if (color & kwsysTerminal_Color_ForegroundBold) {
    fprintf(stream, KWSYS_TERMINAL_VT100_BOLD);
  }
}